

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O1

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char *pcVar4;
  curl_slist *pcVar5;
  char *pcVar6;
  bool bVar7;
  bool bVar8;
  char in_AL;
  int iVar9;
  long *plVar10;
  long *plVar11;
  void **ppvVar12;
  char *pcVar13;
  size_t sVar14;
  void *pvVar15;
  curl_httppost *pcVar16;
  curl_httppost *pcVar17;
  uint uVar18;
  undefined8 in_RCX;
  ulong uVar19;
  long lVar20;
  curl_httppost **ppcVar21;
  undefined8 in_RDX;
  FormInfo *ptr;
  long *plVar22;
  char *pcVar23;
  size_t sVar24;
  undefined8 in_R8;
  undefined8 in_R9;
  CURLFORMcode CVar25;
  int *piVar26;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list arg;
  void **local_160;
  char *local_148;
  void *local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_160 = &arg[0].overflow_arg_area;
  uVar18 = 0x10;
  local_e8[2] = (void *)in_RDX;
  local_e8[3] = (void *)in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  plVar10 = (long *)(*Curl_ccalloc)(1,0x68);
  if (plVar10 == (long *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  bVar7 = false;
  pcVar23 = (char *)0x0;
  piVar26 = (int *)0x0;
  CVar25 = CURL_FORMADD_OK;
  plVar22 = plVar10;
switchD_00118a0d_caseD_9:
  bVar8 = bVar7;
  do {
    bVar7 = bVar8;
    plVar11 = plVar10;
    if (CVar25 != CURL_FORMADD_OK) goto LAB_0011911a;
    if ((!bVar7) || (piVar26 == (int *)0x0)) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      iVar9 = *(int *)ppvVar12;
      if (iVar9 == 0x11) goto LAB_0011918e;
      break;
    }
    iVar9 = *piVar26;
    pcVar23 = *(char **)(piVar26 + 2);
    piVar26 = piVar26 + 4;
    CVar25 = CURL_FORMADD_OK;
    bVar8 = false;
  } while (iVar9 == 0x11);
  CVar25 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar13 = pcVar23;
  switch(iVar9) {
  case 1:
    goto switchD_00118a0d_caseD_1;
  case 2:
    *(byte *)(plVar22 + 5) = *(byte *)(plVar22 + 5) | 4;
switchD_00118a0d_caseD_1:
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (*plVar22 == 0) {
      if (!bVar7) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar12 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar12 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar13 = (char *)*ppvVar12;
      }
      CVar25 = CURL_FORMADD_NULL;
      if (pcVar13 != (char *)0x0) {
        *plVar22 = (long)pcVar13;
        CVar25 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00118a0d_caseD_9;
  case 3:
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar22[1] == 0) {
      if (!bVar7) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar12 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar12 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar13 = (char *)*ppvVar12;
      }
      plVar22[1] = (long)pcVar13;
      CVar25 = CURL_FORMADD_OK;
    }
    goto switchD_00118a0d_caseD_9;
  case 4:
    goto switchD_00118a0d_caseD_4;
  case 5:
    *(byte *)(plVar22 + 5) = *(byte *)(plVar22 + 5) | 8;
switchD_00118a0d_caseD_4:
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar22[2] != 0) goto switchD_00118a0d_caseD_9;
    if (!bVar7) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar13 = (char *)*ppvVar12;
    }
    CVar25 = CURL_FORMADD_NULL;
    if (pcVar13 == (char *)0x0) goto switchD_00118a0d_caseD_9;
    break;
  case 6:
    goto switchD_00118a0d_caseD_6;
  case 7:
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if ((*(byte *)(plVar22 + 5) & 10) == 0) {
      if (!bVar7) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar12 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar12 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar13 = (char *)*ppvVar12;
      }
      CVar25 = CURL_FORMADD_NULL;
      if (pcVar13 != (char *)0x0) {
        pcVar13 = (*Curl_cstrdup)(pcVar13);
        plVar22[2] = (long)pcVar13;
        CVar25 = CURL_FORMADD_MEMORY;
        if (pcVar13 != (char *)0x0) {
          *(byte *)(plVar22 + 5) = *(byte *)(plVar22 + 5) | 2;
          goto LAB_001190b5;
        }
      }
    }
    goto switchD_00118a0d_caseD_9;
  case 8:
    CVar25 = CURL_FORMADD_ILLEGAL_ARRAY;
    if (!bVar7) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      piVar26 = (int *)*ppvVar12;
      bVar7 = piVar26 != (int *)0x0;
      CVar25 = (uint)(piVar26 == (int *)0x0) * 3;
    }
  default:
    goto switchD_00118a0d_caseD_9;
  case 10:
    if (!bVar7) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar13 = (char *)*ppvVar12;
    }
    if (plVar22[2] == 0) {
      CVar25 = CURL_FORMADD_NULL;
      if (pcVar13 != (char *)0x0) {
        pcVar13 = (*Curl_cstrdup)(pcVar13);
        plVar22[2] = (long)pcVar13;
        CVar25 = CURL_FORMADD_MEMORY;
        if (pcVar13 != (char *)0x0) {
          *(byte *)(plVar22 + 5) = *(byte *)(plVar22 + 5) | 1;
LAB_001190b5:
          *(undefined1 *)((long)plVar22 + 0x61) = 1;
          CVar25 = CURL_FORMADD_OK;
        }
      }
    }
    else {
      CVar25 = CURL_FORMADD_OPTION_TWICE;
      if (((*(byte *)(plVar22 + 5) & 1) != 0) &&
         (CVar25 = CURL_FORMADD_NULL, pcVar13 != (char *)0x0)) {
        local_148 = (*Curl_cstrdup)(pcVar13);
        CVar25 = CURL_FORMADD_MEMORY;
        if (local_148 != (char *)0x0) {
          plVar11 = (long *)(*Curl_ccalloc)(1,0x68);
          if (plVar11 == (long *)0x0) {
            plVar11 = (long *)0x0;
          }
          else {
            plVar11[2] = (long)local_148;
            plVar11[5] = 1;
            plVar11[0xb] = plVar22[0xb];
            plVar22[0xb] = (long)plVar11;
          }
          if (plVar11 == (long *)0x0) goto LAB_001190f8;
          *(undefined1 *)((long)plVar11 + 0x61) = 1;
LAB_001190ed:
          CVar25 = CURL_FORMADD_OK;
          plVar22 = plVar11;
        }
      }
    }
    goto switchD_00118a0d_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar7) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar13 = (char *)*ppvVar12;
    }
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar22[8] == 0) {
      pcVar13 = (*Curl_cstrdup)(pcVar13);
      plVar22[8] = (long)pcVar13;
      CVar25 = CURL_FORMADD_MEMORY;
      if (pcVar13 != (char *)0x0) {
        *(undefined1 *)((long)plVar22 + 99) = 1;
        CVar25 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00118a0d_caseD_9;
  case 0xc:
    *(byte *)(plVar22 + 5) = *(byte *)(plVar22 + 5) | 0x30;
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar22[6] != 0) goto switchD_00118a0d_caseD_9;
    if (!bVar7) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar13 = (char *)*ppvVar12;
    }
    CVar25 = CURL_FORMADD_NULL;
    if (pcVar13 == (char *)0x0) goto switchD_00118a0d_caseD_9;
    plVar22[6] = (long)pcVar13;
    break;
  case 0xd:
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar22[7] == 0) {
      if (!bVar7) {
        uVar19 = (ulong)uVar18;
        if (uVar19 < 0x29) {
          uVar18 = uVar18 + 8;
          ppvVar12 = (void **)((long)local_e8 + uVar19);
        }
        else {
          ppvVar12 = local_160;
          local_160 = local_160 + 1;
        }
        pcVar13 = (char *)*ppvVar12;
      }
      plVar22[7] = (long)pcVar13;
      CVar25 = CURL_FORMADD_OK;
    }
    goto switchD_00118a0d_caseD_9;
  case 0xe:
    if (!bVar7) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar13 = (char *)*ppvVar12;
    }
    if (plVar22[4] == 0) {
      CVar25 = CURL_FORMADD_NULL;
      if (pcVar13 != (char *)0x0) {
        pcVar13 = (*Curl_cstrdup)(pcVar13);
        plVar22[4] = (long)pcVar13;
        CVar25 = CURL_FORMADD_MEMORY;
        if (pcVar13 != (char *)0x0) {
          *(undefined1 *)((long)plVar22 + 0x62) = 1;
          CVar25 = CURL_FORMADD_OK;
        }
      }
    }
    else {
      CVar25 = CURL_FORMADD_OPTION_TWICE;
      if (((*(byte *)(plVar22 + 5) & 1) != 0) &&
         (CVar25 = CURL_FORMADD_NULL, pcVar13 != (char *)0x0)) {
        local_148 = (*Curl_cstrdup)(pcVar13);
        CVar25 = CURL_FORMADD_MEMORY;
        if (local_148 != (char *)0x0) {
          plVar11 = (long *)(*Curl_ccalloc)(1,0x68);
          if (plVar11 == (long *)0x0) {
            plVar11 = (long *)0x0;
          }
          else {
            plVar11[4] = (long)local_148;
            plVar11[5] = 1;
            plVar11[0xb] = plVar22[0xb];
            plVar22[0xb] = (long)plVar11;
          }
          if (plVar11 != (long *)0x0) {
            *(undefined1 *)((long)plVar11 + 0x62) = 1;
            goto LAB_001190ed;
          }
LAB_001190f8:
          CVar25 = CURL_FORMADD_MEMORY;
          (*Curl_cfree)(local_148);
        }
      }
    }
    goto switchD_00118a0d_caseD_9;
  case 0xf:
    if (!bVar7) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar13 = (char *)*ppvVar12;
    }
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar22[10] == 0) {
      plVar22[10] = (long)pcVar13;
      CVar25 = CURL_FORMADD_OK;
    }
    goto switchD_00118a0d_caseD_9;
  case 0x13:
    *(byte *)(plVar22 + 5) = *(byte *)(plVar22 + 5) | 0x40;
    CVar25 = CURL_FORMADD_OPTION_TWICE;
    if (plVar22[9] != 0) goto switchD_00118a0d_caseD_9;
    if (!bVar7) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar13 = (char *)*ppvVar12;
    }
    CVar25 = CURL_FORMADD_NULL;
    if (pcVar13 == (char *)0x0) goto switchD_00118a0d_caseD_9;
    plVar22[9] = (long)pcVar13;
    break;
  case 0x14:
    *(byte *)(plVar22 + 5) = *(byte *)(plVar22 + 5) | 0x80;
switchD_00118a0d_caseD_6:
    if (!bVar7) {
      uVar19 = (ulong)uVar18;
      if (uVar19 < 0x29) {
        uVar18 = uVar18 + 8;
        ppvVar12 = (void **)((long)local_e8 + uVar19);
      }
      else {
        ppvVar12 = local_160;
        local_160 = local_160 + 1;
      }
      pcVar13 = (char *)*ppvVar12;
    }
    plVar22[3] = (long)pcVar13;
    CVar25 = CURL_FORMADD_OK;
    goto switchD_00118a0d_caseD_9;
  }
  plVar22[2] = (long)pcVar13;
  CVar25 = CURL_FORMADD_OK;
  goto switchD_00118a0d_caseD_9;
LAB_0011911a:
  do {
    if ((char)plVar11[0xc] == '\x01') {
      (*Curl_cfree)((void *)*plVar11);
      *plVar11 = 0;
      *(undefined1 *)(plVar11 + 0xc) = 0;
    }
    if (*(char *)((long)plVar11 + 0x61) == '\x01') {
      (*Curl_cfree)((void *)plVar11[2]);
      plVar11[2] = 0;
      *(undefined1 *)((long)plVar11 + 0x61) = 0;
    }
    if (*(char *)((long)plVar11 + 0x62) == '\x01') {
      (*Curl_cfree)((void *)plVar11[4]);
      plVar11[4] = 0;
      *(undefined1 *)((long)plVar11 + 0x62) = 0;
    }
    if (*(char *)((long)plVar11 + 99) == '\x01') {
      (*Curl_cfree)((void *)plVar11[8]);
      plVar11[8] = 0;
      *(undefined1 *)((long)plVar11 + 99) = 0;
    }
    plVar22 = plVar11 + 0xb;
    plVar11 = (long *)*plVar22;
  } while ((long *)*plVar22 != (long *)0x0);
  if (CVar25 == CURL_FORMADD_OK) {
LAB_0011918e:
    CVar25 = CURL_FORMADD_OK;
    pcVar23 = (char *)0x0;
    plVar22 = plVar10;
    pcVar17 = (curl_httppost *)0x0;
    do {
      if (*plVar22 == 0) {
        if (pcVar17 != (curl_httppost *)0x0) goto LAB_001191b6;
LAB_0011947f:
        CVar25 = CURL_FORMADD_INCOMPLETE;
        break;
      }
      if (plVar22[2] == 0 && pcVar17 == (curl_httppost *)0x0) goto LAB_0011947f;
LAB_001191b6:
      if ((plVar22[3] != 0) && ((*(byte *)(plVar22 + 5) & 1) != 0)) goto LAB_0011947f;
      uVar19 = plVar22[5];
      if (((~(uint)uVar19 & 9) == 0) ||
         ((uVar18 = ~(uint)uVar19, (uVar18 & 10) == 0 || ((uVar18 & 0x30) == 0 && plVar22[6] == 0)))
         ) goto LAB_0011947f;
      if (((uVar19 & 0x11) != 0) && (plVar22[4] == 0)) {
        plVar11 = plVar22 + 8;
        if ((uVar19 & 0x10) == 0) {
          plVar11 = plVar22 + 2;
        }
        pcVar13 = Curl_mime_contenttype((char *)*plVar11);
        if (pcVar13 == (char *)0x0) {
          pcVar13 = pcVar23;
        }
        if (pcVar13 == (char *)0x0) {
          pcVar13 = "application/octet-stream";
        }
        pcVar13 = (*Curl_cstrdup)(pcVar13);
        plVar22[4] = (long)pcVar13;
        if (pcVar13 == (char *)0x0) {
          CVar25 = CURL_FORMADD_MEMORY;
          break;
        }
        *(undefined1 *)((long)plVar22 + 0x62) = 1;
      }
      pcVar13 = (char *)*plVar22;
      if ((pcVar13 != (char *)0x0) && (plVar22[1] != 0)) {
        lVar20 = 0;
        do {
          if (pcVar13[lVar20] == '\0') {
            CVar25 = CURL_FORMADD_NULL;
            break;
          }
          lVar20 = lVar20 + 1;
        } while (plVar22[1] != lVar20);
        if (CVar25 != CURL_FORMADD_OK) break;
      }
      if ((plVar22 == plVar10) && ((plVar22[5] & 4U) == 0)) {
        if (pcVar13 != (char *)0x0) {
          sVar24 = plVar22[1];
          if (sVar24 == 0) {
            sVar14 = strlen(pcVar13);
            sVar24 = sVar14 + 1;
          }
          pvVar15 = Curl_memdup(pcVar13,sVar24);
          *plVar22 = (long)pvVar15;
        }
        if (*plVar22 != 0) {
          *(undefined1 *)(plVar22 + 0xc) = 1;
          goto LAB_001192d0;
        }
LAB_00119487:
        CVar25 = CURL_FORMADD_MEMORY;
        break;
      }
LAB_001192d0:
      if (((*(byte *)(plVar22 + 5) & 0x6b) == 0) &&
         (pcVar13 = (char *)plVar22[2], pcVar13 != (char *)0x0)) {
        sVar24 = plVar22[3];
        if (sVar24 == 0) {
          sVar14 = strlen(pcVar13);
          sVar24 = sVar14 + 1;
        }
        pvVar15 = Curl_memdup(pcVar13,sVar24);
        plVar22[2] = (long)pvVar15;
        if (pvVar15 == (void *)0x0) {
          CVar25 = CURL_FORMADD_MEMORY;
          break;
        }
        *(undefined1 *)((long)plVar22 + 0x61) = 1;
      }
      pcVar13 = (char *)*plVar22;
      sVar14 = plVar22[1];
      pcVar1 = (char *)plVar22[2];
      lVar20 = plVar22[3];
      pcVar2 = (char *)plVar22[6];
      lVar3 = plVar22[7];
      pcVar4 = (char *)plVar22[4];
      uVar19 = plVar22[5];
      pcVar5 = (curl_slist *)plVar22[10];
      pcVar6 = (char *)plVar22[8];
      pvVar15 = (void *)plVar22[9];
      pcVar16 = (curl_httppost *)(*Curl_ccalloc)(1,0x70);
      if (pcVar16 == (curl_httppost *)0x0) {
        pcVar16 = (curl_httppost *)0x0;
      }
      else {
        pcVar16->name = pcVar13;
        if (pcVar13 == (char *)0x0) {
          sVar14 = 0;
        }
        else if (sVar14 == 0) {
          sVar14 = strlen(pcVar13);
        }
        pcVar16->namelength = sVar14;
        pcVar16->contents = pcVar1;
        pcVar16->contentlen = lVar20;
        pcVar16->buffer = pcVar2;
        pcVar16->bufferlength = lVar3;
        pcVar16->contenttype = pcVar4;
        pcVar16->contentheader = pcVar5;
        pcVar16->showfilename = pcVar6;
        pcVar16->userp = pvVar15;
        pcVar16->flags = uVar19 | 0x80;
        if (pcVar17 == (curl_httppost *)0x0) {
          pcVar17 = *last_post;
          if (*last_post == (curl_httppost *)0x0) {
            pcVar17 = (curl_httppost *)httppost;
          }
          pcVar17->next = pcVar16;
          ppcVar21 = last_post;
        }
        else {
          pcVar16->more = pcVar17->more;
          ppcVar21 = &pcVar17->more;
        }
        *ppcVar21 = pcVar16;
      }
      if (pcVar16 == (curl_httppost *)0x0) goto LAB_00119487;
      plVar11 = plVar22 + 4;
      plVar22 = (long *)plVar22[0xb];
      if ((char *)*plVar11 != (char *)0x0) {
        pcVar23 = (char *)*plVar11;
      }
      pcVar17 = pcVar16;
    } while (plVar22 != (long *)0x0);
    if (CVar25 == CURL_FORMADD_OK) {
      CVar25 = CURL_FORMADD_OK;
    }
    else {
      for (; plVar22 != (long *)0x0; plVar22 = (long *)plVar22[0xb]) {
        if ((char)plVar22[0xc] == '\x01') {
          (*Curl_cfree)((void *)*plVar22);
          *plVar22 = 0;
          *(undefined1 *)(plVar22 + 0xc) = 0;
        }
        if (*(char *)((long)plVar22 + 0x61) == '\x01') {
          (*Curl_cfree)((void *)plVar22[2]);
          plVar22[2] = 0;
          *(undefined1 *)((long)plVar22 + 0x61) = 0;
        }
        if (*(char *)((long)plVar22 + 0x62) == '\x01') {
          (*Curl_cfree)((void *)plVar22[4]);
          plVar22[4] = 0;
          *(undefined1 *)((long)plVar22 + 0x62) = 0;
        }
        if (*(char *)((long)plVar22 + 99) == '\x01') {
          (*Curl_cfree)((void *)plVar22[8]);
          plVar22[8] = 0;
          *(undefined1 *)((long)plVar22 + 99) = 0;
        }
      }
    }
  }
  do {
    plVar22 = (long *)plVar10[0xb];
    (*Curl_cfree)(plVar10);
    plVar10 = plVar22;
  } while (plVar22 != (long *)0x0);
  return CVar25;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}